

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall trento::Deuteron::Deuteron(Deuteron *this,double a,double b)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *in_RDI;
  ulong in_XMM0_Qa;
  ulong in_XMM1_Qa;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t in_stack_00000008;
  
  Nucleus::Nucleus((Nucleus *)b,in_stack_00000008);
  *in_RDI = &PTR__Deuteron_0016ca00;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_XMM1_Qa;
  auVar5 = vminsd_avx(auVar5,auVar3);
  uVar1 = vcmpsd_avx512f(auVar3,auVar3,3);
  bVar2 = (bool)((byte)uVar1 & 1);
  in_RDI[5] = bVar2 * in_XMM1_Qa + (ulong)!bVar2 * auVar5._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar5 = vmaxsd_avx(auVar6,auVar4);
  uVar1 = vcmpsd_avx512f(auVar4,auVar4,3);
  bVar2 = (bool)((byte)uVar1 & 1);
  in_RDI[6] = bVar2 * in_XMM1_Qa + (ulong)!bVar2 * auVar5._0_8_;
  return;
}

Assistant:

Deuteron::Deuteron(double a, double b)
    : Nucleus(2),
      a_(std::fmin(a, b)),
      b_(std::fmax(a, b))
{}